

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath_tests.cpp
# Opt level: O0

void __thiscall
iu_FilePath_x_iutest_x_IsRootDirectory_Test::~iu_FilePath_x_iutest_x_IsRootDirectory_Test
          (iu_FilePath_x_iutest_x_IsRootDirectory_Test *this)

{
  iu_FilePath_x_iutest_x_IsRootDirectory_Test *this_local;
  
  ~iu_FilePath_x_iutest_x_IsRootDirectory_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

IUTEST(FilePath, IsRootDirectory)
{
    {
        ::iutest::internal::FilePath path;
        IUTEST_EXPECT_FALSE(path.IsRootDirectory());
    }
    {
        ::iutest::internal::FilePath path("path");
        IUTEST_EXPECT_FALSE(path.IsRootDirectory());
    }
    {
#ifdef IUTEST_OS_WINDOWS
        ::iutest::internal::FilePath path("C:\\");
        IUTEST_EXPECT_TRUE(path.IsRootDirectory());
#else
        ::iutest::internal::FilePath path("/");
        IUTEST_EXPECT_TRUE(path.IsRootDirectory());
#endif
    }
}